

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest5::logError
          (FunctionalTest5 *this,GLchar *(*subroutine_names) [2],GLuint *subroutine_combination,
          vec4<float> *input_data,vec4<float> *first_routine_result,
          vec4<float> *second_routine_result,vec4<float> *third_routine_result,
          vec4<unsigned_int> *fourth_routine_result,vec4<float> *first_routine_expected_result,
          vec4<float> *second_routine_expected_result,vec4<float> *third_routine_expected_result,
          vec4<unsigned_int> *fourth_routine_expected_result)

{
  vec4<float> *this_00;
  ostringstream *poVar1;
  MessageBuilder *pMVar2;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  
  local_330._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_330 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Error. Invalid result.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_330._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_330 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Function: ");
  pMVar2 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_330,*subroutine_names + *subroutine_combination);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"( ");
  Utils::vec4<float>::log(input_data,__x);
  std::operator<<((ostream *)poVar1,", ");
  this_00 = input_data + 1;
  Utils::vec4<float>::log(this_00,__x_00);
  std::operator<<((ostream *)poVar1," ). Result: ");
  Utils::vec4<float>::log(first_routine_result,__x_01);
  std::operator<<((ostream *)poVar1,". Expected: ");
  Utils::vec4<float>::log(first_routine_expected_result,__x_02);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator=((MessageBuilder *)local_330,(MessageBuilder *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)poVar1,"Function: ");
  pMVar2 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_330,subroutine_names[1] + subroutine_combination[1]);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"( ");
  Utils::vec4<float>::log(input_data,__x_03);
  std::operator<<((ostream *)poVar1," ). Result: ");
  Utils::vec4<float>::log(second_routine_result,__x_04);
  std::operator<<((ostream *)poVar1,". Expected: ");
  Utils::vec4<float>::log(second_routine_expected_result,__x_05);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator=((MessageBuilder *)local_330,(MessageBuilder *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)poVar1,"Function: ");
  pMVar2 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_330,subroutine_names[2] + subroutine_combination[2]);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"( ");
  Utils::vec4<float>::log(input_data,__x_06);
  std::operator<<((ostream *)poVar1,", ");
  Utils::vec4<float>::log(this_00,__x_07);
  std::operator<<((ostream *)poVar1,", ");
  Utils::vec4<float>::log(input_data + 2,__x_08);
  std::operator<<((ostream *)poVar1,"). Result: ");
  Utils::vec4<float>::log(third_routine_result,__x_09);
  std::operator<<((ostream *)poVar1,". Expected: ");
  Utils::vec4<float>::log(third_routine_expected_result,__x_10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator=((MessageBuilder *)local_330,(MessageBuilder *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)poVar1,"Function: ");
  pMVar2 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_330,subroutine_names[3] + subroutine_combination[3]);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"( ");
  Utils::vec4<float>::log(input_data,__x_11);
  std::operator<<((ostream *)poVar1,", ");
  Utils::vec4<float>::log(this_00,__x_12);
  std::operator<<((ostream *)poVar1,", ");
  std::operator<<((ostream *)poVar1," ). Result: ");
  Utils::vec4<unsigned_int>::log(fourth_routine_result,__x_13);
  std::operator<<((ostream *)poVar1,". Expected: ");
  Utils::vec4<unsigned_int>::log(fourth_routine_expected_result,__x_14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  return;
}

Assistant:

void FunctionalTest5::logError(const glw::GLchar* subroutine_names[4][2], const glw::GLuint subroutine_combination[4],
							   const Utils::vec4<glw::GLfloat>  input_data[3],
							   const Utils::vec4<glw::GLfloat>& first_routine_result,
							   const Utils::vec4<glw::GLfloat>& second_routine_result,
							   const Utils::vec4<glw::GLfloat>& third_routine_result,
							   const Utils::vec4<glw::GLuint>&  fourth_routine_result,
							   const Utils::vec4<glw::GLfloat>& first_routine_expected_result,
							   const Utils::vec4<glw::GLfloat>& second_routine_expected_result,
							   const Utils::vec4<glw::GLfloat>& third_routine_expected_result,
							   const Utils::vec4<glw::GLuint>&  fourth_routine_expected_result) const
{
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
										<< tcu::TestLog::EndMessage;

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[0][subroutine_combination[0]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << " ). Result: ";
	first_routine_result.log(message);
	message << ". Expected: ";
	first_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[1][subroutine_combination[1]] << "( ";
	input_data[0].log(message);
	message << " ). Result: ";
	second_routine_result.log(message);
	message << ". Expected: ";
	second_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[2][subroutine_combination[2]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << ", ";
	input_data[2].log(message);
	message << "). Result: ";
	third_routine_result.log(message);
	message << ". Expected: ";
	third_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[3][subroutine_combination[3]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << ", ";
	message << " ). Result: ";
	fourth_routine_result.log(message);
	message << ". Expected: ";
	fourth_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;
}